

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

nn_hash_item * nn_hash_get(nn_hash *self,uint32_t key)

{
  uint uVar1;
  uint32_t uVar2;
  nn_list *pnVar3;
  uint32_t in_ESI;
  uint *in_RDI;
  nn_hash_item *item;
  nn_list_item *it;
  uint32_t slot;
  nn_hash_item *it_00;
  nn_list *self_00;
  nn_list *local_20;
  
  uVar2 = nn_hash_key(in_ESI);
  uVar1 = *in_RDI;
  local_20 = (nn_list *)
             nn_list_begin((nn_list *)(*(long *)(in_RDI + 2) + (ulong)(uVar2 % uVar1) * 0x10));
  while( true ) {
    self_00 = local_20;
    pnVar3 = (nn_list *)
             nn_list_end((nn_list *)(*(long *)(in_RDI + 2) + (ulong)(uVar2 % uVar1) * 0x10));
    if (self_00 == pnVar3) {
      return (nn_hash_item *)0x0;
    }
    if (local_20 == (nn_list *)0x0) {
      it_00 = (nn_hash_item *)0x0;
    }
    else {
      it_00 = (nn_hash_item *)&local_20[-1].last;
    }
    if (it_00->key == in_ESI) break;
    local_20 = (nn_list *)nn_list_next(self_00,(nn_list_item *)it_00);
  }
  return it_00;
}

Assistant:

struct nn_hash_item *nn_hash_get (struct nn_hash *self, uint32_t key)
{
    uint32_t slot;
    struct nn_list_item *it;
    struct nn_hash_item *item;

    slot = nn_hash_key (key) % self->slots;

    for (it = nn_list_begin (&self->array [slot]);
          it != nn_list_end (&self->array [slot]);
          it = nn_list_next (&self->array [slot], it)) {
        item = nn_cont (it, struct nn_hash_item, list);
        if (item->key == key)
            return item;
    }

    return NULL;
}